

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.cc
# Opt level: O2

int __thiscall
draco::MeshAttributeCornerTable::ConfidentValence(MeshAttributeCornerTable *this,VertexIndex v)

{
  int iVar1;
  VertexRingIterator<draco::MeshAttributeCornerTable> vi;
  VertexRingIterator<draco::MeshAttributeCornerTable> local_28;
  
  local_28.start_corner_.value_ =
       (this->vertex_to_left_most_corner_map_).
       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[v.value_].value_;
  local_28.left_traversal_ = true;
  iVar1 = 0;
  local_28.corner_table_ = this;
  local_28.corner_.value_ = local_28.start_corner_.value_;
  while (local_28.corner_.value_ != 0xffffffff) {
    iVar1 = iVar1 + 1;
    VertexRingIterator<draco::MeshAttributeCornerTable>::Next(&local_28);
  }
  return iVar1;
}

Assistant:

int MeshAttributeCornerTable::ConfidentValence(VertexIndex v) const {
  DRACO_DCHECK_LT(v.value(), num_vertices());
  draco::VertexRingIterator<MeshAttributeCornerTable> vi(this, v);
  int valence = 0;
  for (; !vi.End(); vi.Next()) {
    ++valence;
  }
  return valence;
}